

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O3

string * __thiscall
t_dart_generator::dart_library
          (string *__return_storage_ptr__,t_dart_generator *this,string *file_name)

{
  long *plVar1;
  long *plVar2;
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  std::operator+(&local_68,"library ",&this->library_prefix_);
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_68,(ulong)(this->library_name_)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_38 = *plVar2;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar2;
    local_48 = (long *)*plVar1;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (file_name->_M_string_length != 0) {
    if ((this->library_prefix_)._M_string_length == 0) {
      std::operator+(&local_68,".src.",file_name);
      std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
    }
    else {
      std::operator+(&local_68,".",file_name);
      std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_48 != &local_38) {
    operator_delete(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_dart_generator::dart_library(string file_name) {
  string out = "library " + library_prefix_ + library_name_;
  if (!file_name.empty()) {
    if (library_prefix_.empty()) {
      out += ".src." + file_name;
    } else {
      out += "." + file_name;
    }
  }
  return out + ";\n";
}